

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getConstraintsUpperBound
          (OptimalControlProblem *this,double time,double infinity,VectorDynSize *upperBound)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  _Rb_tree_header *p_Var4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  long lVar8;
  ulong in_XMM1_Qb;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> upperBoundMap;
  ostringstream errorMsg;
  string local_1f8;
  char *local_1d8;
  ulong uStack_1d0;
  double local_1c8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  long local_1a8;
  undefined8 local_1a0;
  long local_190;
  undefined8 uStack_188;
  undefined1 local_180;
  long local_178;
  undefined8 local_168;
  
  local_1d8 = (char *)infinity;
  uStack_1d0 = in_XMM1_Qb;
  local_1c8 = time;
  uVar3 = iDynTree::VectorDynSize::size();
  uVar2 = getConstraintsDimension(this);
  if (uVar3 != uVar2) {
    getConstraintsDimension(this);
    iDynTree::VectorDynSize::resize((ulong)upperBound);
  }
  toEigen(&local_1c0,upperBound);
  p_Var6 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  local_1d8 = (char *)((ulong)local_1d8 & 0x7fffffffffffffff);
  uStack_1d0 = uStack_1d0 & 0x7fffffffffffffff;
  lVar8 = 0;
  do {
    if ((_Rb_tree_header *)p_Var6 == p_Var4) {
LAB_001812f0:
      return (_Rb_tree_header *)p_Var6 == p_Var4;
    }
    bVar1 = ConstraintsGroup::getUpperBound
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2),local_1c8,
                       (VectorDynSize *)(*(undefined8 **)(p_Var6 + 2) + 2));
    if (!bVar1) {
      toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1a8,
              (VectorDynSize *)(*(long *)(p_Var6 + 2) + 0x10));
      local_1f8._M_dataplus._M_p = local_1d8;
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::setConstant((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)&local_1a8,(Scalar *)&local_1f8);
    }
    uVar3 = iDynTree::VectorDynSize::size();
    uVar2 = ConstraintsGroup::constraintsDimension
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2));
    if (uVar3 != uVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar7 = std::operator<<((ostream *)&local_1a8,
                               "Upper bound dimension different from dimension of group ");
      ConstraintsGroup::name_abi_cxx11_
                (&local_1f8,(ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2));
      poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
      std::operator<<(poVar7,".");
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("OptimalControlProblem","getConstraintsUpperBound",local_1f8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      goto LAB_001812f0;
    }
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1f8,
            (VectorDynSize *)(*(long *)(p_Var6 + 2) + 0x10));
    local_1a0 = iDynTree::VectorDynSize::size();
    local_1a8 = lVar8 * 8 + local_1c0._0_8_;
    local_180 = local_1c0._16_1_;
    local_190 = local_1c0._0_8_;
    uStack_188 = local_1c0._8_8_;
    local_168 = local_1c0._8_8_;
    local_178 = lVar8;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
                *)&local_1a8,
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1f8);
    lVar5 = iDynTree::VectorDynSize::size();
    lVar8 = lVar8 + lVar5;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

bool OptimalControlProblem::getConstraintsUpperBound(double time, double infinity, VectorDynSize &upperBound)
        {
            if (upperBound.size() != getConstraintsDimension()) {
                upperBound.resize(getConstraintsDimension());
            }

            Eigen::Map< Eigen::VectorXd > upperBoundMap = toEigen(upperBound);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (! group.second->group_ptr->getUpperBound(time, group.second->constraintsBuffer)){
                    toEigen(group.second->constraintsBuffer).setConstant(std::abs(infinity)); //if not upper bounded
                }

                if (group.second->constraintsBuffer.size() != group.second->group_ptr->constraintsDimension()){
                    std::ostringstream errorMsg;
                    errorMsg << "Upper bound dimension different from dimension of group " << group.second->group_ptr->name() << ".";
                    reportError("OptimalControlProblem", "getConstraintsUpperBound", errorMsg.str().c_str());
                    return false;
                }

                upperBoundMap.segment(offset, group.second->constraintsBuffer.size()) = toEigen(group.second->constraintsBuffer);
                offset += group.second->constraintsBuffer.size();
            }

            return true;
        }